

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O0

bool __thiscall AudioLogger::install(AudioLogger *this,Parameters *parameters)

{
  int iVar1;
  SDL_AudioDeviceID SVar2;
  uint uVar3;
  undefined8 uVar4;
  long in_RSI;
  SDL_AudioSpec obtainedSpec;
  SDL_AudioSpec captureSpec;
  int i;
  int nDevices;
  Data *data;
  uint uVar5;
  uint in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined1 local_94 [44];
  uint local_68;
  ushort local_64;
  byte local_62;
  ushort local_60;
  undefined4 local_48;
  undefined2 local_44;
  undefined1 local_42;
  undefined2 local_40;
  code *local_38;
  uint local_28;
  uint local_24;
  Data *local_20;
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_20 = getData((AudioLogger *)0x153019);
  if (*(int *)(local_18 + 0x20) < 0) {
    fprintf(_stderr,"error : invalid captureId = %d\n",(ulong)*(uint *)(local_18 + 0x20));
    local_1 = false;
  }
  else if (*(int *)(local_18 + 0x24) < 0) {
    fprintf(_stderr,"error : invalid nChannels = %d\n",(ulong)*(uint *)(local_18 + 0x24));
    local_1 = false;
  }
  else if (*(long *)(local_18 + 0x28) < 1) {
    fprintf(_stderr,"error : invalid sampleRate = %d\n",*(ulong *)(local_18 + 0x28) & 0xffffffff);
    local_1 = false;
  }
  else if (0.0 < *(float *)(local_18 + 0x38)) {
    if (((install::isInitialized & 1U) == 0) && (iVar1 = SDL_Init(0x10), iVar1 < 0)) {
      uVar4 = SDL_GetError();
      SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar4);
      local_1 = false;
    }
    else {
      install::isInitialized = true;
      local_24 = SDL_GetNumAudioDevices(1);
      printf("Found %d capture devices:\n",(ulong)local_24);
      for (local_28 = 0; (int)local_28 < (int)local_24; local_28 = local_28 + 1) {
        in_stack_ffffffffffffff34 = local_28;
        uVar4 = SDL_GetAudioDeviceName(local_28,1);
        printf("    - Capture device #%d: \'%s\'\n",(ulong)in_stack_ffffffffffffff34,uVar4);
      }
      if ((*(int *)(local_18 + 0x20) < 0) || ((int)local_24 <= *(int *)(local_18 + 0x20))) {
        fprintf(_stderr,"error : invalid capture device id selected - %d\n",
                (ulong)*(uint *)(local_18 + 0x20));
        local_1 = false;
      }
      else {
        SDL_memset(&local_48,0,0x20);
        local_48 = (undefined4)*(undefined8 *)(local_18 + 0x28);
        local_44 = 0x8120;
        local_42 = (undefined1)*(undefined4 *)(local_18 + 0x24);
        local_40 = 0x200;
        local_38 = anon_unknown.dwarf_4801e::cbAudioReady;
        SDL_memset(&local_68,0,0x20);
        uVar5 = *(uint *)(local_18 + 0x20);
        uVar4 = SDL_GetAudioDeviceName(*(undefined4 *)(local_18 + 0x20),1);
        printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)uVar5,uVar4);
        uVar4 = SDL_GetAudioDeviceName(*(undefined4 *)(local_18 + 0x20),1);
        SVar2 = SDL_OpenAudioDevice(uVar4,1,&local_48,&local_68,4);
        local_20->deviceIdIn = SVar2;
        if (local_20->deviceIdIn == 0) {
          uVar4 = SDL_GetError();
          SDL_LogError(0,"Couldn\'t open an audio device for capture: %s!\n",uVar4);
          SDL_Quit();
          local_1 = false;
        }
        else {
          uVar3 = (uint)local_64;
          if ((((uVar3 == 8) || (uVar3 == 0x10)) || (uVar3 == 0x8008)) ||
             ((uVar3 == 0x8010 || (uVar3 == 0x8020)))) {
            fprintf(_stderr,"error : unsupported sample format %d\n",(ulong)local_64);
            local_1 = false;
          }
          else {
            if (uVar3 == 0x8120) {
              local_20->sampleSize_bytes = 4;
            }
            printf("Opened capture device succesfully!\n");
            printf("    DeviceId:   %d\n",(ulong)local_20->deviceIdIn);
            printf("    Frequency:  %d\n",(ulong)local_68);
            printf("    Format:     %d (%d bytes)\n",(ulong)local_64,
                   (ulong)(uint)local_20->sampleSize_bytes);
            printf("    Channels:   %d\n",(ulong)local_62);
            printf("    Samples:    %d\n",(ulong)local_60);
            if (((uint)local_62 != *(uint *)(local_18 + 0x24)) && (*(int *)(local_18 + 0x24) != 0))
            {
              printf("Warning: obtained number of channels (%d) does not match requested (%d)\n",
                     (ulong)local_62,(ulong)*(uint *)(local_18 + 0x24));
            }
            SDL_PauseAudioDevice(local_20->deviceIdIn,0);
            *(uint *)(local_18 + 0x24) = (uint)local_62;
            iVar1 = *(int *)(local_18 + 0x34);
            if (iVar1 != 0) {
              if (iVar1 == 1) {
                calculateCoefficientsFirstOrderHighPass
                          (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
                memcpy(&local_20->filterCoefficients,local_94,0x2c);
              }
              else if (iVar1 == 2) {
                calculateCoefficientsSecondOrderButterworthHighPass
                          (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
                memcpy(&local_20->filterCoefficients,&stack0xffffffffffffff40,0x2c);
              }
            }
            Parameters::operator=
                      ((Parameters *)CONCAT44(in_stack_ffffffffffffff34,uVar5),
                       (Parameters *)CONCAT44(uVar3,iVar1));
            std::atomic<bool>::operator=
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff34,uVar5),
                       SUB41(uVar3 >> 0x18,0));
            printf("    Audio Filter: %d\n",(ulong)*(uint *)(local_18 + 0x34));
            printf("    Cutoff frequency: %g Hz\n",(double)*(float *)(local_18 + 0x38));
            printf("Capturing audio ..\n");
            local_1 = true;
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"error : invalid freqCutoff_Hz = %g\n",(double)*(float *)(local_18 + 0x38));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AudioLogger::install(Parameters && parameters) {
    auto & data = getData();

    if (parameters.captureId < 0) {
        fprintf(stderr, "error : invalid captureId = %d\n", parameters.captureId);
        return false;
    }

    if (parameters.nChannels < 0) {
        fprintf(stderr, "error : invalid nChannels = %d\n", parameters.nChannels);
        return false;
    }

    if (parameters.sampleRate <= 0) {
        fprintf(stderr, "error : invalid sampleRate = %d\n", (int) parameters.sampleRate);
        return false;
    }

    if (parameters.freqCutoff_Hz <= 0) {
        fprintf(stderr, "error : invalid freqCutoff_Hz = %g\n", parameters.freqCutoff_Hz);
        return false;
    }

    static bool isInitialized = false;
    if (!isInitialized && SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return false;
    }
    isInitialized = true;

    int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
    printf("Found %d capture devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
    }

    if (parameters.captureId < 0 || parameters.captureId >= nDevices) {
        fprintf(stderr, "error : invalid capture device id selected - %d\n", parameters.captureId);
        return false;
    }

    SDL_AudioSpec captureSpec;
    SDL_zero(captureSpec);

    captureSpec.freq = parameters.sampleRate;
    captureSpec.format = AUDIO_F32SYS;
    captureSpec.channels = parameters.nChannels;
    captureSpec.samples = kSamplesPerFrame;
    captureSpec.callback = ::cbAudioReady;
    captureSpec.userdata = this;

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open capture device %d : '%s' ...\n", parameters.captureId, SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE));
    data.deviceIdIn = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!data.deviceIdIn) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for capture: %s!\n", SDL_GetError());
        SDL_Quit();
        return false;
    }

    switch (obtainedSpec.format) {
        case AUDIO_U8:
        case AUDIO_S8:
        case AUDIO_U16SYS:
        case AUDIO_S16SYS:
        case AUDIO_S32SYS:
            {
                fprintf(stderr, "error : unsupported sample format %d\n", obtainedSpec.format);
                return false;
            }
            break;
        case AUDIO_F32SYS:
            {
                data.sampleSize_bytes = 4;
            }
            break;
    }

    printf("Opened capture device succesfully!\n");
    printf("    DeviceId:   %d\n", data.deviceIdIn);
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, data.sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    if (obtainedSpec.channels != parameters.nChannels && parameters.nChannels != 0) {
        printf("Warning: obtained number of channels (%d) does not match requested (%d)\n",
               obtainedSpec.channels, parameters.nChannels);
    }

    SDL_PauseAudioDevice(data.deviceIdIn, 0);

    parameters.nChannels = obtainedSpec.channels;

    switch (parameters.filter) {
        case EAudioFilter::None:
            {
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
    };

    data.parameters = parameters;
    data.isReady = true;

    // print filter paramters
    printf("    Audio Filter: %d\n", parameters.filter);
    printf("    Cutoff frequency: %g Hz\n", parameters.freqCutoff_Hz);
    printf("Capturing audio ..\n");

    return true;
}